

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O1

void __thiscall
NfcFilter::process3(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  float fVar9;
  float fVar11;
  undefined8 uVar10;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pfVar8 = src.mData;
  fVar14 = (this->third).z[0];
  uVar10 = *(undefined8 *)((this->third).z + 1);
  if (pfVar8 != src.mDataEnd) {
    fVar1 = (this->third).gain;
    fVar2 = (this->third).b1;
    fVar3 = (this->third).b2;
    fVar4 = (this->third).b3;
    fVar5 = (this->third).a1;
    fVar6 = (this->third).a2;
    fVar7 = (this->third).a3;
    fVar12 = fVar14;
    do {
      fVar9 = (float)uVar10;
      fVar13 = -fVar6 * fVar9 + *pfVar8 * fVar1 + fVar12 * -fVar5;
      fVar14 = fVar13 + fVar12;
      fVar11 = (float)((ulong)uVar10 >> 0x20);
      fVar13 = -fVar7 * fVar11 + fVar3 * fVar9 + fVar2 * fVar12 + fVar13;
      uVar10 = CONCAT44(fVar11 + fVar13,fVar9 + fVar12);
      *dst = fVar11 * fVar4 + fVar13;
      pfVar8 = pfVar8 + 1;
      dst = dst + 1;
      fVar12 = fVar14;
    } while (pfVar8 != src.mDataEnd);
  }
  (this->third).z[0] = fVar14;
  *(undefined8 *)((this->third).z + 1) = uVar10;
  return;
}

Assistant:

void NfcFilter::process3(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{third.gain};
    const float b1{third.b1};
    const float b2{third.b2};
    const float b3{third.b3};
    const float a1{third.a1};
    const float a2{third.a2};
    const float a3{third.a3};
    float z1{third.z[0]};
    float z2{third.z[1]};
    float z3{third.z[2]};
    auto proc_sample = [gain,b1,b2,b3,a1,a2,a3,&z1,&z2,&z3](const float in) noexcept -> float
    {
        float y{in*gain - a1*z1 - a2*z2};
        float out{y + b1*z1 + b2*z2};
        z2 += z1;
        z1 += y;

        y = out - a3*z3;
        out = y + b3*z3;
        z3 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    third.z[0] = z1;
    third.z[1] = z2;
    third.z[2] = z3;
}